

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O1

Dim * __thiscall
cnn::Sparsemax::dim_forward
          (Dim *__return_storage_ptr__,Sparsemax *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  ulong uVar1;
  pointer pDVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  invalid_argument *this_00;
  ulong uVar7;
  ulong uVar8;
  ostringstream s;
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  pDVar2 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pDVar2 == 0x24) {
    uVar7 = (ulong)pDVar2->nd;
    if (uVar7 < 2) {
LAB_0026e1ed:
      __return_storage_ptr__->bd = pDVar2->bd;
      uVar3 = *(undefined8 *)(pDVar2->d + 2);
      uVar4 = *(undefined8 *)(pDVar2->d + 4);
      uVar5 = *(undefined8 *)(pDVar2->d + 6);
      *(undefined8 *)__return_storage_ptr__->d = *(undefined8 *)pDVar2->d;
      *(undefined8 *)(__return_storage_ptr__->d + 2) = uVar3;
      *(undefined8 *)(__return_storage_ptr__->d + 4) = uVar4;
      *(undefined8 *)(__return_storage_ptr__->d + 6) = uVar5;
      return __return_storage_ptr__;
    }
    if (pDVar2->d[1] == 1) {
      uVar8 = 1;
      do {
        if ((2 - uVar7) + uVar8 == 1) goto LAB_0026e1ed;
        uVar1 = uVar8 + 1;
        lVar6 = uVar8 + 1;
        uVar8 = uVar1;
      } while (pDVar2->d[lVar6] == 1);
      if (uVar7 <= uVar1) goto LAB_0026e1ed;
    }
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Bad input dimensions in Sparsemax: ",0x23);
  operator<<((ostream *)local_190,xs);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this_00,local_1b0);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim Sparsemax::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 1 || !LooksLikeVector(xs[0])) {
    ostringstream s; s << "Bad input dimensions in Sparsemax: " << xs;
    throw std::invalid_argument(s.str());
  }
  return xs[0];
}